

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O0

DecimalQuantity * __thiscall
icu_63::number::impl::DecimalQuantity::setToLong(DecimalQuantity *this,int64_t n)

{
  long local_18;
  int64_t n_local;
  DecimalQuantity *this_local;
  
  setBcdToZero(this);
  this->flags = '\0';
  local_18 = n;
  if ((n < 0) && (-0x8000000000000000 < n)) {
    this->flags = this->flags | ::(anonymous_namespace)::NEGATIVE_FLAG;
    local_18 = -n;
  }
  if (local_18 != 0) {
    _setToLong(this,local_18);
    compact(this);
  }
  return this;
}

Assistant:

DecimalQuantity &DecimalQuantity::setToLong(int64_t n) {
    setBcdToZero();
    flags = 0;
    if (n < 0 && n > INT64_MIN) {
        flags |= NEGATIVE_FLAG;
        n = -n;
    }
    if (n != 0) {
        _setToLong(n);
        compact();
    }
    return *this;
}